

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O3

void trstep(double *jac,double *sN,int N,double *dx,double *L,double *hess,double nlen,double *ioval
           ,double eps,double *step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *vec;
  double *vec_00;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_f8;
  double local_d8;
  double local_a8;
  
  dVar1 = *ioval;
  dVar14 = ioval[1];
  dVar2 = ioval[2];
  local_a8 = ioval[3];
  dVar13 = ioval[4];
  local_d8 = ioval[5];
  vec = (double *)malloc((long)N * 8);
  vec_00 = (double *)malloc((long)N * 8);
  uVar8 = (ulong)(uint)N;
  if (nlen <= dVar1 * 1.5) {
    ioval[6] = 1.0;
    if (0 < N) {
      uVar5 = 0;
      do {
        step[uVar5] = sN[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
    }
    uVar9 = 0;
    uVar10 = 0;
    if (dVar1 <= nlen) {
      nlen = dVar1;
    }
LAB_001270a1:
    *ioval = nlen;
    ioval[1] = (double)CONCAT44(uVar10,uVar9);
    ioval[2] = dVar2;
    ioval[3] = local_a8;
    ioval[4] = dVar13;
    ioval[5] = local_d8;
    free(vec);
    free(vec_00);
    return;
  }
  ioval[6] = 0.0;
  if (0.0 < dVar14) {
    dVar14 = dVar14 - (((dVar2 - dVar1) + local_a8) * (dVar2 + local_a8)) / (dVar13 * dVar1);
  }
  if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
    ioval[7] = 0.0;
    if (N < 1) {
      *vec_00 = NAN;
    }
    else {
      uVar5 = 0;
      do {
        vec[uVar5] = dx[uVar5] * dx[uVar5] * sN[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      *vec_00 = *vec / *L;
      if (N != 1) {
        pdVar6 = L + uVar8;
        uVar5 = 1;
        do {
          dVar13 = 0.0;
          uVar7 = 0;
          do {
            dVar13 = dVar13 + vec_00[uVar7] * pdVar6[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
          vec_00[uVar5] = (vec[uVar5] - dVar13) / L[uVar5 * uVar8 + uVar5];
          uVar5 = uVar5 + 1;
          pdVar6 = pdVar6 + uVar8;
        } while (uVar5 != uVar8);
      }
    }
    dVar13 = l2norm(vec_00,N);
    local_d8 = (-dVar13 * dVar13) / nlen;
  }
  if (0 < N) {
    uVar5 = 0;
    do {
      vec[uVar5] = jac[uVar5] / dx[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  dVar11 = -(nlen - dVar1) / local_d8;
  dVar3 = l2norm(vec,N);
  dVar3 = dVar3 / dVar1;
  do {
    if ((dVar14 < dVar11) || (dVar3 < dVar14)) {
      dVar14 = dVar3 * dVar11;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      if (dVar14 <= dVar3 * 0.001) {
        dVar14 = dVar3 * 0.001;
      }
    }
    if (N < 1) {
      cholmod(hess,N,L,eps,0.0);
      scale(jac,1,N,-1.0);
      linsolve_lower(L,N,jac,step);
      scale(jac,1,N,-1.0);
LAB_00126f5f:
      local_f8 = l2norm(vec,N);
      local_a8 = local_f8 - dVar1;
LAB_00126f81:
      *vec_00 = *vec / *L;
    }
    else {
      iVar4 = 0;
      uVar5 = 0;
      do {
        hess[iVar4] = dVar14 * dx[uVar5] * dx[uVar5] + hess[iVar4];
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + N + 1;
      } while (uVar8 != uVar5);
      cholmod(hess,N,L,eps,0.0);
      scale(jac,1,N,-1.0);
      linsolve_lower(L,N,jac,step);
      scale(jac,1,N,-1.0);
      if (N < 1) goto LAB_00126f5f;
      iVar4 = 0;
      uVar5 = 0;
      do {
        hess[iVar4] = dx[uVar5] * -dVar14 * dx[uVar5] + hess[iVar4];
        uVar5 = uVar5 + 1;
        iVar4 = iVar4 + N + 1;
      } while (uVar8 != uVar5);
      if (N < 1) goto LAB_00126f5f;
      uVar5 = 0;
      do {
        vec[uVar5] = step[uVar5] * dx[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      local_f8 = l2norm(vec,N);
      local_a8 = local_f8 - dVar1;
      if (N < 1) goto LAB_00126f81;
      uVar5 = 0;
      do {
        vec[uVar5] = dx[uVar5] * vec[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      *vec_00 = *vec / *L;
      if (1 < N) {
        uVar5 = 1;
        pdVar6 = L + uVar8;
        do {
          dVar13 = 0.0;
          uVar7 = 0;
          do {
            dVar13 = dVar13 + vec_00[uVar7] * pdVar6[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
          vec_00[uVar5] = (vec[uVar5] - dVar13) / L[uVar5 * uVar8 + uVar5];
          uVar5 = uVar5 + 1;
          pdVar6 = pdVar6 + uVar8;
        } while (uVar5 != uVar8);
      }
    }
    dVar13 = l2norm(vec_00,N);
    dVar13 = (-dVar13 * dVar13) / local_f8;
    uVar9 = SUB84(dVar14,0);
    uVar10 = (undefined4)((ulong)dVar14 >> 0x20);
    nlen = dVar1;
    if ((dVar1 * 0.75 <= local_f8 && local_f8 <= dVar1 * 1.5) || (0.0 <= dVar3 - dVar11))
    goto LAB_001270a1;
    dVar12 = dVar14 - local_a8 / dVar13;
    uVar5 = -(ulong)(dVar11 <= dVar12);
    dVar11 = (double)(-(ulong)(local_a8 < 0.0) & (ulong)dVar14 |
                     ~-(ulong)(local_a8 < 0.0) & (~uVar5 & (ulong)dVar11 | (ulong)dVar12 & uVar5));
    dVar14 = dVar14 - (local_f8 * local_a8) / (dVar13 * dVar1);
  } while( true );
}

Assistant:

void trstep(double *jac,double *sN,int N,double * dx,double *L,double *hess,double nlen,double *ioval,double eps,
		double *step) {
	int i,c1,iter,j;
	double sum,tvec,l1,l2,maxadd,steplen;
	double hi,lo,lambdalo,lambdahi;
	double delta,lambda,deltaprev,phi,phid,phidinit;
	double *temp1,*temp2;
	
	hi = 1.5;lo = 0.75;
	delta = ioval[0];lambda = ioval[1]; deltaprev = ioval[2];
	phi = ioval[3]; phid = ioval[4] ; phidinit = ioval[5];
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	
	if (nlen <= hi*delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		lambda = 0.;
		if (delta > nlen) {
			delta = nlen;
		}
		
	} else {
			ioval[6] = 0.0;
			if (lambda > 0.) {
				lambda -= (phi+deltaprev) * ((deltaprev - delta) + phi) /(delta * phid);
			}
			phi = nlen - delta;
			if (ioval[7] == 1.0) {
				ioval[7] = 0.0;
				for(i=0;i < N;++i) {
					temp1[i] = dx[i] * dx[i] * sN[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phidinit = - tvec*tvec/nlen;
			}
			lambdalo = - phi/phidinit;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i]/dx[i];
			}
			tvec = l2norm(temp1,N);
			lambdahi = tvec / delta;
			iter = 0;
			while (iter == 0) {
				if (lambda < lambdalo || lambda > lambdahi) {
					l1 = sqrt(lambdalo * lambdahi);
					l2 = 0.001 *lambdahi;
					if (l1 > l2) {
						lambda = l1;
					} else {
						lambda = l2;
					}
				}
				
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] += lambda * dx[i] * dx[i];
				}
				maxadd = cholmod(hess,N,L,eps,0.0);
				scale(jac,1,N,-1.0);
				linsolve_lower(L,N,jac,step);
				scale(jac,1,N,-1.0);
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] -= lambda * dx[i] * dx[i];
				}
				for(i=0;i < N;++i) {
					temp1[i] = step[i] * dx[i];
				}
				steplen = l2norm(temp1,N);
				phi = steplen - delta;
				for(i=0;i < N;++i) {
					temp1[i] *= dx[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phid = - tvec*tvec/steplen;
				
				if ( (steplen >= lo * delta && steplen <= hi * delta ) || (lambdahi - lambdalo >= 0))  {
					iter = 1;
				} else {
					if (lambdalo <= lambda - (phi/phid)) {
						lambdalo = lambda - (phi/phid);
					}
					if (phi < 0) {
						lambdalo = lambda;
					}
					
					lambda -= (steplen *phi)/(delta*phid);
				}
				
			}
			
	}
	
	ioval[0] = delta;ioval[1] =lambda; ioval[2] = deltaprev;
	ioval[3] = phi; ioval[4] = phid ;ioval[5] = phidinit;
	
	free(temp1);
	free(temp2);
}